

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&> *
testing::internal::
MatcherCastImpl<const_google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&,_google::protobuf::internal::(anonymous_namespace)::IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_10UL,_0UL,_0UL,_8UL>_*,_int,_int_*>_>
::Cast(Matcher<const_google::protobuf::internal::TcParseTableBase::FieldEntry_*const_&>
       *__return_storage_ptr__,
      IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_10UL,_0UL,_0UL,_8UL>_*,_int,_int_*>
      *polymorphic_matcher_or_value)

{
  IsEntryForFieldNumMatcherP3<google::protobuf::internal::TcParseTable<0UL,_10UL,_0UL,_0UL,_8UL>_*,_int,_int_*>
  *polymorphic_matcher_or_value_local;
  
  CastImpl<false>(__return_storage_ptr__,polymorphic_matcher_or_value);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> Cast(const M& polymorphic_matcher_or_value) {
    // M can be a polymorphic matcher, in which case we want to use
    // its conversion operator to create Matcher<T>.  Or it can be a value
    // that should be passed to the Matcher<T>'s constructor.
    //
    // We can't call Matcher<T>(polymorphic_matcher_or_value) when M is a
    // polymorphic matcher because it'll be ambiguous if T has an implicit
    // constructor from M (this usually happens when T has an implicit
    // constructor from any type).
    //
    // It won't work to unconditionally implicit_cast
    // polymorphic_matcher_or_value to Matcher<T> because it won't trigger
    // a user-defined conversion from M to T if one exists (assuming M is
    // a value).
    return CastImpl(polymorphic_matcher_or_value,
                    std::is_convertible<M, Matcher<T>>{},
                    std::is_convertible<M, T>{});
  }